

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                *generators,bool is_end)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
  *in_RSI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
  *in_stack_ffffffffffffff58;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
  *in_stack_ffffffffffffff60;
  ParamGenerator<aom_rc_mode> *in_stack_ffffffffffffff68;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
  *in_stack_ffffffffffffff70;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
  ::ParamIteratorInterface
            (&in_RDI->
              super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
            );
  (in_RDI->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f38458;
  in_RDI->base_ = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d1671);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d1690);
  ParamGenerator<libaom_test::TestMode>::begin
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff68);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d16ac);
  ParamGenerator<aom_superblock_size>::begin
            ((ParamGenerator<aom_superblock_size> *)in_stack_ffffffffffffff68);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d16c8);
  ParamGenerator<aom_rc_mode>::begin(in_stack_ffffffffffffff68);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>,_true,_true>
            (in_stack_ffffffffffffff70,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68,
             (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff60,
             (ParamIterator<aom_superblock_size> *)in_stack_ffffffffffffff58,
             (ParamIterator<aom_rc_mode> *)0x3d16f8);
  ParamIterator<aom_rc_mode>::~ParamIterator((ParamIterator<aom_rc_mode> *)0x3d1704);
  ParamIterator<aom_superblock_size>::~ParamIterator((ParamIterator<aom_superblock_size> *)0x3d170e)
  ;
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x3d1718);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x3d1725);
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d1740);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d175c);
  ParamGenerator<libaom_test::TestMode>::end
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff68);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d1778);
  ParamGenerator<aom_superblock_size>::end
            ((ParamGenerator<aom_superblock_size> *)in_stack_ffffffffffffff68);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<aom_superblock_size>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<aom_superblock_size>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x3d1794);
  ParamGenerator<aom_rc_mode>::end(in_stack_ffffffffffffff68);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>,_true,_true>
            (in_stack_ffffffffffffff70,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68,
             (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff60,
             (ParamIterator<aom_superblock_size> *)in_stack_ffffffffffffff58,
             (ParamIterator<aom_rc_mode> *)0x3d17c1);
  ParamIterator<aom_rc_mode>::~ParamIterator((ParamIterator<aom_rc_mode> *)0x3d17cd);
  ParamIterator<aom_superblock_size>::~ParamIterator((ParamIterator<aom_superblock_size> *)0x3d17d7)
  ;
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x3d17e1);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x3d17eb);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::tuple(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
  ::shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
                *)0x3d1845);
  ComputeCurrentValue(in_RDI);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }